

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

void __thiscall
Employee::Employee(Employee *this,string *name,string *id,Address *address,int h,int ph,int wtd,
                  int wd)

{
  int iVar1;
  string local_50 [32];
  
  Person::Person(&this->super_Person,name,id,address);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_00107d60;
  this->hourWork = h;
  this->salaryPerHour = ph;
  this->workToDo = wtd;
  this->workDone = wd;
  std::__cxx11::string::string(local_50,(string *)id);
  iVar1 = (**(this->super_Person)._vptr_Person)(this,local_50);
  std::__cxx11::string::~string(local_50);
  if ((char)iVar1 != '\0') {
    return;
  }
  std::operator<<((ostream *)&std::cout,"Invalid input");
  exit(1);
}

Assistant:

Employee::Employee(const string &name, const string &id, const Address &address, int h, int ph, int wtd, int wd) :
        Person(name, id, address) {
    this->hourWork = h;
    this->salaryPerHour = ph;
    this->workToDo = wtd;
    this->workDone = wd;
    if (!validate(id)) { // if the id was invalid exit the program
        cout << "Invalid input";
        exit(1);
    }

}